

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O1

void jinit_master_decompress(j_decompress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  boolean bVar2;
  jpeg_decomp_master *pjVar3;
  void *__s;
  uint need_full_buffer;
  long lVar4;
  
  pjVar3 = (jpeg_decomp_master *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x30);
  cinfo->master = pjVar3;
  pjVar3->prepare_for_output_pass = prepare_for_output_pass;
  pjVar3->finish_output_pass = finish_output_pass;
  pjVar3->is_dummy_pass = 0;
  jpeg_calc_output_dimensions(cinfo);
  __s = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x580);
  cinfo->sample_range_limit = (JSAMPLE *)((long)__s + 0x100);
  lVar4 = 0;
  memset(__s,0,0x100);
  do {
    ((JSAMPLE *)((long)__s + 0x100))[lVar4] = (JSAMPLE)lVar4;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  memset((void *)((long)__s + 0x200),0xff,0x180);
  memset((void *)((long)__s + 0x380),0,0x180);
  memcpy((void *)((long)__s + 0x500),cinfo->sample_range_limit,0x80);
  if ((long)cinfo->out_color_components * (ulong)cinfo->output_width >> 0x20 != 0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x48;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  *(undefined4 *)&pjVar3[1].prepare_for_output_pass = 0;
  bVar2 = use_merged_upsample(cinfo);
  *(boolean *)((long)&pjVar3[1].prepare_for_output_pass + 4) = bVar2;
  pjVar3[1].finish_output_pass = (_func_void_j_decompress_ptr *)0x0;
  *(undefined8 *)&pjVar3[1].is_dummy_pass = 0;
  if ((cinfo->quantize_colors == 0) || (cinfo->buffered_image == 0)) {
    cinfo->enable_1pass_quant = 0;
    cinfo->enable_external_quant = 0;
    cinfo->enable_2pass_quant = 0;
  }
  if (cinfo->quantize_colors != 0) {
    if (cinfo->raw_data_out != 0) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x30;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->out_color_components == 3) {
      if (cinfo->colormap == (JSAMPARRAY)0x0) {
        if (cinfo->two_pass_quantize == 0) {
          cinfo->enable_1pass_quant = 1;
        }
        else {
          cinfo->enable_2pass_quant = 1;
        }
      }
      else {
        cinfo->enable_external_quant = 1;
      }
    }
    else {
      cinfo->enable_1pass_quant = 1;
      cinfo->enable_external_quant = 0;
      cinfo->enable_2pass_quant = 0;
      cinfo->colormap = (JSAMPARRAY)0x0;
    }
    if (cinfo->enable_1pass_quant != 0) {
      jinit_1pass_quantizer(cinfo);
      pjVar3[1].finish_output_pass = (_func_void_j_decompress_ptr *)cinfo->cquantize;
    }
    if ((cinfo->enable_2pass_quant != 0) || (cinfo->enable_external_quant != 0)) {
      jinit_2pass_quantizer(cinfo);
      *(jpeg_color_quantizer **)&pjVar3[1].is_dummy_pass = cinfo->cquantize;
    }
  }
  if (cinfo->raw_data_out == 0) {
    if (*(int *)((long)&pjVar3[1].prepare_for_output_pass + 4) == 0) {
      jinit_color_deconverter(cinfo);
      jinit_upsampler(cinfo);
    }
    else {
      jinit_merged_upsampler(cinfo);
    }
    jinit_d_post_controller(cinfo,cinfo->enable_2pass_quant);
  }
  jinit_inverse_dct(cinfo);
  if (cinfo->arith_code == 0) {
    jinit_huff_decoder(cinfo);
  }
  else {
    jinit_arith_decoder(cinfo);
  }
  need_full_buffer = 1;
  if (cinfo->inputctl->has_multiple_scans == 0) {
    need_full_buffer = (uint)(cinfo->buffered_image != 0);
  }
  jinit_d_coef_controller(cinfo,need_full_buffer);
  if (cinfo->raw_data_out == 0) {
    jinit_d_main_controller(cinfo,0);
  }
  (*cinfo->mem->realize_virt_arrays)((j_common_ptr)cinfo);
  (*cinfo->inputctl->start_input_pass)(cinfo);
  return;
}

Assistant:

GLOBAL(void)
jinit_master_decompress (j_decompress_ptr cinfo)
{
  my_master_ptr master;

  master = (my_master_ptr)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(my_decomp_master));
  cinfo->master = (struct jpeg_decomp_master *) master;
  master->pub.prepare_for_output_pass = prepare_for_output_pass;
  master->pub.finish_output_pass = finish_output_pass;

  master->pub.is_dummy_pass = FALSE;

  master_selection(cinfo);
}